

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O0

void eval_topn(s2_semi_mgau_t *s,int32 feat,mfcc_t *z)

{
  int iVar1;
  int iVar2;
  vqFeature_t *pvVar3;
  vqFeature_t vVar4;
  bool bVar5;
  int local_70;
  int32 j;
  int32 cw;
  mfcc_t *obs;
  float *pfStack_58;
  mfcc_t d;
  mfcc_t *var;
  vqFeature_t vtmp;
  mfcc_t compl;
  mfcc_t sqdiff;
  mfcc_t diff;
  mfcc_t *mean;
  vqFeature_t *topn;
  int32 ceplen;
  int32 i;
  mfcc_t *z_local;
  int32 feat_local;
  s2_semi_mgau_t *s_local;
  
  pvVar3 = s->f[feat];
  iVar1 = s->veclen[feat];
  for (topn._4_4_ = 0; topn._4_4_ < s->max_topn; topn._4_4_ = topn._4_4_ + 1) {
    iVar2 = pvVar3[topn._4_4_].codeword;
    pfStack_58 = (float *)(s->vars[feat] + iVar2 * iVar1);
    obs._4_4_ = s->dets[feat][iVar2];
    _j = z;
    _sqdiff = (float *)(s->means[feat] + iVar2 * iVar1);
    for (local_70 = 0; local_70 < iVar1; local_70 = local_70 + 1) {
      obs._4_4_ = (mfcc_t)((float)obs._4_4_ -
                          ((float)*_j - *_sqdiff) * ((float)*_j - *_sqdiff) * *pfStack_58);
      pfStack_58 = pfStack_58 + 1;
      _j = (mfcc_t *)((float *)_j + 1);
      _sqdiff = _sqdiff + 1;
    }
    pvVar3[topn._4_4_].score = (int)(float)obs._4_4_;
    if (topn._4_4_ != 0) {
      vVar4 = pvVar3[topn._4_4_];
      iVar2 = topn._4_4_;
      while( true ) {
        local_70 = iVar2 + -1;
        bVar5 = false;
        if (-1 < local_70) {
          bVar5 = pvVar3[local_70].score < (int)(float)obs._4_4_;
        }
        if (!bVar5) break;
        pvVar3[iVar2] = pvVar3[local_70];
        iVar2 = local_70;
      }
      pvVar3[iVar2] = vVar4;
    }
  }
  return;
}

Assistant:

static void
eval_topn(s2_semi_mgau_t *s, int32 feat, mfcc_t *z)
{
    int32 i, ceplen;
    vqFeature_t *topn;

    topn = s->f[feat];
    ceplen = s->veclen[feat];

    for (i = 0; i < s->max_topn; i++) {
        mfcc_t *mean, diff, sqdiff, compl; /* diff, diff^2, component likelihood */
        vqFeature_t vtmp;
        mfcc_t *var, d;
        mfcc_t *obs;
        int32 cw, j;

        cw = topn[i].codeword;
        mean = s->means[feat] + cw * ceplen;
        var = s->vars[feat] + cw * ceplen;
        d = s->dets[feat][cw];
        obs = z;
        for (j = 0; j < ceplen; j++) {
            diff = *obs++ - *mean++;
            sqdiff = MFCCMUL(diff, diff);
            compl = MFCCMUL(sqdiff, *var);
            d = GMMSUB(d, compl);
            ++var;
        }
        topn[i].score = (int32)d;
        if (i == 0)
            continue;
        vtmp = topn[i];
        for (j = i - 1; j >= 0 && (int32)d > topn[j].score; j--) {
            topn[j + 1] = topn[j];
        }
        topn[j + 1] = vtmp;
    }
}